

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_short,unsigned_short>
          (Thread *this,UnopFunc<unsigned_short,_unsigned_short> *f)

{
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  SR result;
  unsigned_short local_38 [8];
  Simd<unsigned_short,_(unsigned_char)__b_> local_28;
  
  local_38 = (unsigned_short  [8])Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  std::transform<unsigned_short*,unsigned_short*,unsigned_short(*)(unsigned_short)>
            (local_38,local_28.v,local_28.v,f);
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}